

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O3

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator::
enterNode(FastGeneralizationsIterator *this,Node **curr)

{
  void ***pppvVar1;
  uint uVar2;
  ulong uVar3;
  long *plVar4;
  NodeAlgorithm NVar5;
  int iVar6;
  Node *pNVar7;
  Node *pNVar8;
  void **ppvVar9;
  NodeAlgorithm *pNVar10;
  undefined4 extraout_var;
  uint *puVar11;
  Node *pNVar12;
  long *plVar13;
  TermList *pTVar14;
  Top TVar15;
  TermList binding;
  TermList local_38;
  
  pNVar8 = *curr;
  NVar5 = (*pNVar8->_vptr_Node[5])();
  uVar2 = *(uint *)&pNVar8[1]._vptr_Node;
  local_38._content = (this->_subst)._specVars._array[uVar2]._content;
  *curr = (Node *)0x0;
  pTVar14 = &pNVar8[1]._term;
  if (NVar5 == UNSORTED_LIST) {
    if ((local_38._content & 3) == 0) {
      pNVar8 = (Node *)pTVar14->_content;
      if (pNVar8 == (Node *)0x0) {
        return false;
      }
      iVar6 = *(int *)(local_38._content + 8);
      pNVar12 = (Node *)0x0;
      pNVar7 = (Node *)0x0;
      do {
        uVar3 = (pNVar8->_term)._content;
        if ((uVar3 & 3) != 0) goto LAB_00311171;
        if (pNVar7 == (Node *)0x0) {
          if (*(int *)(uVar3 + 8) == iVar6) {
            *curr = pNVar8;
            pNVar7 = pNVar8;
            pNVar12 = pNVar8;
          }
          else {
            pNVar7 = (Node *)0x0;
          }
        }
        pNVar8 = *(Node **)(pTVar14 + 1);
        pTVar14 = pTVar14 + 1;
      } while (pNVar8 != (Node *)0x0);
      pNVar8 = (Node *)0x0;
LAB_00311171:
      if (pNVar12 == (Node *)0x0) {
        if (((uVar3 & 3) != 0) && (pNVar7 = *(Node **)(pTVar14 + 1), pNVar7 != (Node *)0x0)) {
          plVar13 = (long *)(pTVar14 + 2);
          do {
            uVar3 = (pNVar7->_term)._content;
            if (((uVar3 & 3) == 0) && (*(int *)(uVar3 + 8) == iVar6)) {
              *curr = pNVar7;
              goto LAB_003111d3;
            }
            pNVar7 = (Node *)*plVar13;
            plVar13 = plVar13 + 1;
          } while (pNVar7 != (Node *)0x0);
        }
        if (pNVar8 == (Node *)0x0) {
          return false;
        }
        goto LAB_003111b3;
      }
    }
    else {
      pNVar8 = (Node *)pTVar14->_content;
      while( true ) {
        if (pNVar8 == (Node *)0x0) {
          return false;
        }
        if (((pNVar8->_term)._content & 3) != 0) break;
        pNVar8 = *(Node **)(pTVar14 + 1);
        pTVar14 = pTVar14 + 1;
      }
LAB_003111b3:
      *curr = pNVar8;
      do {
        pTVar14 = pTVar14 + 1;
        if (pTVar14->_content == 0) break;
      } while ((*(byte *)(pTVar14->_content + 8) & 3) == 0);
    }
LAB_003111d3:
    puVar11 = (this->_specVarNumbers)._cursor;
    if (puVar11 == (this->_specVarNumbers)._end) {
      Lib::Stack<unsigned_int>::expand(&this->_specVarNumbers);
      puVar11 = (this->_specVarNumbers)._cursor;
    }
    *puVar11 = uVar2;
    (this->_specVarNumbers)._cursor = puVar11 + 1;
    if (pTVar14->_content == 0) {
      return false;
    }
    ppvVar9 = (this->_alternatives)._cursor;
    if (ppvVar9 == (this->_alternatives)._end) {
      Lib::Stack<void_*>::expand(&this->_alternatives);
      ppvVar9 = (this->_alternatives)._cursor;
    }
    *ppvVar9 = pTVar14;
    pppvVar1 = &(this->_alternatives)._cursor;
    *pppvVar1 = *pppvVar1 + 1;
    pNVar10 = (this->_nodeTypes)._cursor;
    if (pNVar10 == (this->_nodeTypes)._end) {
      Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>::
      expand(&this->_nodeTypes);
      pNVar10 = (this->_nodeTypes)._cursor;
    }
    *pNVar10 = UNSORTED_LIST;
    goto LAB_00311351;
  }
  plVar13 = *(long **)(pTVar14->_content + 8);
  if ((local_38._content & 3) == 0) {
    TVar15 = Kernel::TermList::top(&local_38);
    iVar6 = (*pNVar8->_vptr_Node[10])
                      (pNVar8,TVar15._inner._inner._0_8_,(ulong)(TVar15._inner._inner._8_4_ & 0xff))
    ;
    if ((long *)CONCAT44(extraout_var,iVar6) == (long *)0x0) {
      pNVar7 = *curr;
    }
    else {
      pNVar7 = *(Node **)CONCAT44(extraout_var,iVar6);
      *curr = pNVar7;
    }
    if (pNVar7 == (Node *)0x0) goto LAB_003110ff;
LAB_003112a5:
    if (plVar13 == (long *)0x0) {
      plVar13 = (long *)0x0;
    }
    else if ((*(byte *)(*plVar13 + 8) & 3) == 0) {
      plVar13 = (long *)0x0;
    }
    uVar2 = *(uint *)&pNVar8[1]._vptr_Node;
    puVar11 = (this->_specVarNumbers)._cursor;
    if (puVar11 == (this->_specVarNumbers)._end) {
      Lib::Stack<unsigned_int>::expand(&this->_specVarNumbers);
      puVar11 = (this->_specVarNumbers)._cursor;
    }
    *puVar11 = uVar2;
    (this->_specVarNumbers)._cursor = puVar11 + 1;
    plVar4 = plVar13;
  }
  else {
LAB_003110ff:
    uVar3 = (((Node *)*plVar13)->_term)._content;
    if ((uVar3 & 1) != 0) {
      *curr = (Node *)*plVar13;
      plVar13 = (long *)plVar13[1];
      goto LAB_003112a5;
    }
    plVar4 = (long *)(uVar3 & 2);
  }
  if (plVar4 == (long *)0x0) {
    return false;
  }
  ppvVar9 = (this->_alternatives)._cursor;
  if (ppvVar9 == (this->_alternatives)._end) {
    Lib::Stack<void_*>::expand(&this->_alternatives);
    ppvVar9 = (this->_alternatives)._cursor;
  }
  *ppvVar9 = plVar13;
  pppvVar1 = &(this->_alternatives)._cursor;
  *pppvVar1 = *pppvVar1 + 1;
  pNVar10 = (this->_nodeTypes)._cursor;
  if (pNVar10 == (this->_nodeTypes)._end) {
    Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>::
    expand(&this->_nodeTypes);
    pNVar10 = (this->_nodeTypes)._cursor;
  }
  *pNVar10 = NVar5;
LAB_00311351:
  (this->_nodeTypes)._cursor = pNVar10 + 1;
  return true;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastGeneralizationsIterator::enterNode(Node*& curr)
{
  IntermediateNode* inode=static_cast<IntermediateNode*>(curr);
  NodeAlgorithm currType=inode->algorithm();

  TermList binding = _subst.getSpecVarBinding(inode->childVar);
  curr=0;

  if(currType==UNSORTED_LIST) {
    Node** nl=static_cast<UArrIntermediateNode*>(inode)->_nodes;
    if(binding.isTerm()) {
      unsigned bindingFunctor=binding.term()->functor();
      //let's first skip proper term nodes at the beginning...
      while(*nl && (*nl)->term().isTerm()) {
        //...and have the one that interests us, if we encounter it.
        if(!curr && (*nl)->term().term()->functor()==bindingFunctor) {
          curr=*nl;
        }
        nl++;
      }
      if(!curr && *nl) {
        //we've encountered a variable node, but we still have to check, whether
        //the one proper term node, that interests us, isn't here
        Node** nl2=nl+1;
        while(*nl2) {
          if((*nl2)->term().isTerm() && (*nl2)->term().term()->functor()==bindingFunctor) {
            curr=*nl2;
            break;
          }
          nl2++;
        }
      }
    } else {
      //let's first skip proper term nodes at the beginning
      while(*nl && (*nl)->term().isTerm()) {
        nl++;
      }
    }
    if(!curr && *nl) {
      curr=*(nl++);
      while(*nl && (*nl)->term().isTerm()) {
	nl++;
      }
    }
    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(*nl) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  } else {
    ASS_EQ(currType, SKIP_LIST);
    auto nl=static_cast<SListIntermediateNode*>(inode)->_nodes.listLike();
    if(binding.isTerm()) {
      Node** byTop=inode->childByTop(binding.top(), false);
      if(byTop) {
	curr=*byTop;
      }
    }
    if(!curr && nl->head()->term().isVar()) {
      curr=nl->head();
      nl=nl->tail();
    }
    //in SkipList nodes variables are only at the beginning
    //(so if there aren't any, there aren't any at all)
    if(nl && nl->head()->term().isTerm()) {
      nl=0;
    }
    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(nl) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  }
  return false;
}